

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::clear(SPxSolverBase<double> *this)

{
  SPxSolverBase<double> *in_RDI;
  VectorBase<double> *unaff_retaddr;
  SPxBasisBase<double> *in_stack_00000020;
  SPxStatus in_stack_ffffffffffffffec;
  
  Array<soplex::UnitVectorBase<double>_>::reSize
            ((Array<soplex::UnitVectorBase<double>_> *)in_RDI,in_stack_ffffffffffffffec);
  VectorBase<double>::clear(unaff_retaddr);
  UpdateVector<double>::clear((UpdateVector<double> *)in_RDI);
  VectorBase<double>::clear(unaff_retaddr);
  UpdateVector<double>::clear((UpdateVector<double> *)in_RDI);
  UpdateVector<double>::clear((UpdateVector<double> *)in_RDI);
  VectorBase<double>::clear(unaff_retaddr);
  VectorBase<double>::clear(unaff_retaddr);
  VectorBase<double>::clear(unaff_retaddr);
  VectorBase<double>::clear(unaff_retaddr);
  VectorBase<double>::clear(unaff_retaddr);
  VectorBase<double>::clear(unaff_retaddr);
  forceRecompNonbasicValue(in_RDI);
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
  SPxLPBase<double>::clear(&in_RDI->super_SPxLPBase<double>);
  setBasisStatus(in_RDI,in_stack_ffffffffffffffec);
  if ((in_RDI->super_SPxBasisBase<double>).theLP != (SPxSolverBase<double> *)0x0) {
    SPxBasisBase<double>::reDim(in_stack_00000020);
  }
  IdxSet::clear(&(in_RDI->infeasibilities).super_IdxSet);
  IdxSet::clear(&(in_RDI->infeasibilitiesCo).super_IdxSet);
  DataArray<int>::clear(&in_RDI->isInfeasible);
  DataArray<int>::clear(&in_RDI->isInfeasibleCo);
  return;
}

Assistant:

void SPxSolverBase<R>::clear()
   {
      unitVecs.reSize(0);

      dualRhs.clear();
      dualVec.clear();
      primRhs.clear();
      primVec.clear();
      addVec.clear();
      theURbound.clear();
      theLRbound.clear();
      theUCbound.clear();
      theLCbound.clear();
      theTest.clear();
      theCoTest.clear();

      forceRecompNonbasicValue();
      unInit();
      SPxLPBase<R>::clear();
      setBasisStatus(SPxBasisBase<R>::NO_PROBLEM);

      // clear the basis only when theLP is present, because LP data (nrows, ncols) is used in reDim()
      if(this->theLP != nullptr)
         SPxBasisBase<R>::reDim();

      infeasibilities.clear();
      infeasibilitiesCo.clear();
      isInfeasible.clear();
      isInfeasibleCo.clear();
   }